

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateDefaultOptionalValues(Result *__return_storage_ptr__,Model *format)

{
  uint32 uVar1;
  Rep *pRVar2;
  ModelDescription *pMVar3;
  undefined8 *puVar4;
  ArrayFeatureType *pAVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  string local_50;
  
  pMVar3 = format->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar3->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar6 = (long)(pMVar3->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      puVar4 = *(undefined8 **)(*(long *)((long)ppvVar8 + lVar7) + 0x20);
      if (puVar4 == (undefined8 *)0x0) {
        puVar4 = &Specification::_FeatureType_default_instance_;
      }
      if (*(char *)(puVar4 + 2) == '\x01') {
        if (*(int *)((long)puVar4 + 0x24) == 5) {
          pAVar5 = (ArrayFeatureType *)puVar4[3];
        }
        else {
          pAVar5 = Specification::ArrayFeatureType::default_instance();
        }
        if (((ulong)pAVar5->_oneof_case_[1] < 0x3e) &&
           ((0x2008020000000000U >> ((ulong)pAVar5->_oneof_case_[1] & 0x3f) & 1) != 0)) {
          uVar1 = format->_oneof_case_[0];
          if ((uVar1 != 0x12f) && ((uVar1 != 0x193 && (uVar1 != 500)))) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,
                       "Default optional values are only allowed for neural networks.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
LAB_004ef8f7:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          if (format->specificationversion_ < 5) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,
                       "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_50);
            goto LAB_004ef8f7;
          }
        }
      }
      lVar7 = lVar7 + 8;
    } while (lVar6 * 8 != lVar7);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDefaultOptionalValues(const Specification::Model& format) {
        // - Validate default optional values for NN Model that
        //   - Has default value set if input is optional and spec 5 model
        // - Error out if model is not Neural Network
        const Specification::ModelDescription& description = format.description();

        for (const auto& input : description.input()) {
            if (input.type().isoptional()) {
                switch (input.type().multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        // Default value for optional inputs is applicable
                        // only for NeuralNetwork models with Spec 5 (iOS 14) onwards.
                        if (format.Type_case() != Specification::Model::kNeuralNetwork &&
                            format.Type_case() != Specification::Model::kNeuralNetworkRegressor &&
                            format.Type_case() != Specification::Model::kNeuralNetworkClassifier) {
                            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                          "Default optional values are only allowed for neural networks.");
                        }
                        if (format.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS14) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!");
                        }
                        break;
                    default:
                        break;
                }
            }
        }
        return Result();
    }